

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O0

_Bool blow_after_effects(loc_conflict grid,wchar_t dmg,wchar_t splash,_Bool *fear,_Bool quake)

{
  monster *pmVar1;
  source sVar2;
  source origin;
  _Bool quake_local;
  _Bool *fear_local;
  wchar_t splash_local;
  wchar_t dmg_local;
  loc_conflict grid_local;
  
  if (quake) {
    sVar2 = source_player();
    origin.which = sVar2.which;
    origin._4_4_ = 0;
    origin.what = sVar2.what;
    effect_simple(L'@',origin,"0",L'\0',L'\n',L'\0',L'\0',L'\0',(_Bool *)0x0);
    pmVar1 = square_monster((chunk *)cave,grid);
    if (pmVar1 == (monster *)0x0) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool blow_after_effects(struct loc grid, int dmg, int splash,
							   bool *fear, bool quake)
{
	/* Apply earthquake brand */
	if (quake) {
		effect_simple(EF_EARTHQUAKE, source_player(), "0", 0, 10, 0, 0, 0,
					  NULL);

		/* Monster may be dead or moved */
		if (!square_monster(cave, grid))
			return true;
	}

	return false;
}